

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_k64(jit_State *J,IROp op,uint64_t u64)

{
  ushort uVar1;
  int iVar2;
  IRIns *pIVar3;
  uint local_44;
  IRType t;
  IRRef ref;
  IRIns *cir;
  IRIns *ir;
  uint64_t u64_local;
  IROp op_local;
  jit_State *J_local;
  IRRef ref_1;
  
  pIVar3 = (J->cur).ir;
  iVar2 = 0x15;
  if (op == IR_KNUM) {
    iVar2 = 0xe;
  }
  uVar1 = J->chain[op];
  while (local_44 = (uint)uVar1, local_44 != 0) {
    if (pIVar3[(ulong)local_44 + 1] == (IRIns)u64) goto LAB_0013f2fb;
    uVar1 = *(ushort *)((long)pIVar3 + (ulong)local_44 * 8 + 6);
  }
  local_44 = (J->cur).nk - 2;
  if (local_44 < J->irbotlim) {
    lj_ir_growbot(J);
  }
  (J->cur).nk = local_44;
  pIVar3 = (J->cur).ir + local_44;
  pIVar3[1] = (IRIns)u64;
  (pIVar3->field_1).t.irt = (uint8_t)iVar2;
  (pIVar3->field_1).o = (IROp1)op;
  (pIVar3->field_1).op12 = 0;
  (pIVar3->field_0).prev = J->chain[op];
  J->chain[op] = (IRRef1)local_44;
LAB_0013f2fb:
  return local_44 + iVar2 * 0x1000000;
}

Assistant:

TRef lj_ir_k64(jit_State *J, IROp op, uint64_t u64)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
  IRType t = op == IR_KNUM ? IRT_NUM : IRT_I64;
  for (ref = J->chain[op]; ref; ref = cir[ref].prev)
    if (ir_k64(&cir[ref])->u64 == u64)
      goto found;
  ref = ir_nextk64(J);
  ir = IR(ref);
  ir[1].tv.u64 = u64;
  ir->t.irt = t;
  ir->o = op;
  ir->op12 = 0;
  ir->prev = J->chain[op];
  J->chain[op] = (IRRef1)ref;
found:
  return TREF(ref, t);
}